

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

FiniteAutomaton *
Omega_h::FiniteAutomaton::make_range_nfa
          (FiniteAutomaton *__return_storage_ptr__,int nsymbols,int range_start,int range_end,
          int token)

{
  int from_state;
  int state;
  int local_3c;
  int i;
  int accept_state;
  int start_state;
  int token_local;
  int range_end_local;
  int range_start_local;
  int nsymbols_local;
  FiniteAutomaton *out;
  
  if (range_start < 0) {
    fail("assertion %s failed at %s +%d\n","0 <= range_start",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x7d);
  }
  if (range_end < range_start) {
    fail("assertion %s failed at %s +%d\n","range_start <= range_end",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x7e);
  }
  if (nsymbols < range_end) {
    fail("assertion %s failed at %s +%d\n","range_end <= nsymbols",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x7f);
  }
  FiniteAutomaton(__return_storage_ptr__,nsymbols,true,2);
  from_state = add_state(__return_storage_ptr__);
  state = add_state(__return_storage_ptr__);
  for (local_3c = range_start; local_3c <= range_end; local_3c = local_3c + 1) {
    add_transition(__return_storage_ptr__,from_state,local_3c,state);
  }
  add_accept(__return_storage_ptr__,state,token);
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton FiniteAutomaton::make_range_nfa(
    int nsymbols, int range_start, int range_end, int token) {
  OMEGA_H_CHECK(0 <= range_start);
  OMEGA_H_CHECK(range_start <= range_end);
  OMEGA_H_CHECK(range_end <= nsymbols);
  FiniteAutomaton out(nsymbols, true, 2);
  auto start_state = add_state(out);
  auto accept_state = add_state(out);
  for (int i = range_start; i <= range_end; ++i) {
    add_transition(out, start_state, i, accept_state);
  }
  add_accept(out, accept_state, token);
  return out;
}